

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

Token * __thiscall
OpenMD::SelectionCompiler::tokenNext(Token *__return_storage_ptr__,SelectionCompiler *this)

{
  size_t sVar1;
  pointer pTVar2;
  _func_void__Op_any_ptr__Arg_ptr *p_Var3;
  int iVar4;
  _Arg __arg;
  _Arg local_10;
  
  sVar1 = this->itokenInfix;
  pTVar2 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (sVar1 == ((long)(this->atokenInfix).
                      super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) * -0x5555555555555555)
  {
    __return_storage_ptr__->tok = 0;
    __return_storage_ptr__->intValue = 0;
    (__return_storage_ptr__->value)._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    (__return_storage_ptr__->value)._M_storage._M_ptr = (void *)0x0;
    __return_storage_ptr__->tok = 5;
    *(undefined8 *)&__return_storage_ptr__->intValue = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->value)._M_manager + 4) = 0;
    *(undefined4 *)((long)&(__return_storage_ptr__->value)._M_storage + 4) = 0;
  }
  else {
    this->itokenInfix = sVar1 + 1;
    iVar4 = pTVar2[sVar1].intValue;
    __return_storage_ptr__->tok = pTVar2[sVar1].tok;
    __return_storage_ptr__->intValue = iVar4;
    (__return_storage_ptr__->value)._M_storage._M_ptr = (void *)0x0;
    local_10._M_obj = &__return_storage_ptr__->value;
    p_Var3 = pTVar2[sVar1].value._M_manager;
    if (p_Var3 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (local_10._M_any)->_M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    else {
      (*p_Var3)(_Op_clone,&pTVar2[sVar1].value,&local_10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token SelectionCompiler::tokenNext() {
    if (itokenInfix == atokenInfix.size()) { return Token(); }
    return atokenInfix[itokenInfix++];
  }